

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

void __thiscall basisu::basisu_frontend::init_endpoint_training_vectors(basisu_frontend *this)

{
  array_of_weighted_training_vecs *this_00;
  job_pool *this_01;
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 *puVar3;
  unsigned_long *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint32_t uVar9;
  undefined1 auVar10 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  _Any_data local_58;
  undefined1 local_48 [24];
  
  debug_printf("init_endpoint_training_vectors\n");
  this_00 = &(this->m_endpoint_clusterizer).m_training_vecs;
  uVar6 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
  uVar7 = this->m_total_blocks * 2;
  if (uVar6 != uVar7) {
    if (uVar6 <= uVar7) {
      if ((this->m_endpoint_clusterizer).m_training_vecs.m_capacity < uVar7) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar7,uVar6 + 1 == uVar7,0x20,
                   vector<std::pair<basisu::vec<6U,_float>,_unsigned_long>_>::object_mover,false);
      }
      auVar1 = _DAT_0027d800;
      uVar6 = (this->m_endpoint_clusterizer).m_training_vecs.m_size;
      if (uVar6 != uVar7) {
        uVar2 = (ulong)(uVar7 - uVar6) + 0x7ffffffffffffff;
        uVar8 = uVar2 & 0x7ffffffffffffff;
        auVar10._8_4_ = (int)uVar8;
        auVar10._0_8_ = uVar8;
        auVar10._12_4_ = (int)(uVar8 >> 0x20);
        puVar4 = &(this->m_endpoint_clusterizer).m_training_vecs.m_p[(ulong)uVar6 + 1].second;
        lVar5 = 0;
        auVar11 = pmovsxbq(in_XMM1,0x100);
        auVar10 = auVar10 ^ _DAT_0027d800;
        do {
          auVar12._8_4_ = (int)lVar5;
          auVar12._0_8_ = lVar5;
          auVar12._12_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar12 = (auVar12 | auVar11) ^ auVar1;
          if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                      auVar10._4_4_ < auVar12._4_4_) & 1)) {
            puVar4[-4] = 0;
          }
          if (auVar12._12_4_ <= auVar10._12_4_ &&
              (auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_)) {
            *puVar4 = 0;
          }
          lVar5 = lVar5 + 2;
          puVar4 = puVar4 + 8;
        } while ((uVar8 - ((uint)uVar2 & 1)) + 2 != lVar5);
      }
    }
    (this->m_endpoint_clusterizer).m_training_vecs.m_size = uVar7;
  }
  uVar9 = this->m_total_blocks;
  if (uVar9 != 0) {
    uVar6 = 0;
    do {
      uVar7 = uVar6 + 0x4000;
      if (uVar7 <= uVar9) {
        uVar9 = uVar7;
      }
      this_01 = (this->m_params).m_pJob_pool;
      local_48._0_16_ = (undefined1  [16])0x0;
      local_58 = (_Any_data)0x0;
      puVar3 = (undefined8 *)operator_new(0x18);
      *puVar3 = this;
      *(uint *)(puVar3 + 1) = uVar6;
      *(uint32_t *)((long)puVar3 + 0xc) = uVar9;
      puVar3[2] = this_00;
      local_58._M_unused._M_object = puVar3;
      local_48._8_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:863:35)>
           ::_M_invoke;
      local_48._0_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp:863:35)>
           ::_M_manager;
      job_pool::add_job(this_01,(function<void_()> *)&local_58);
      if ((code *)local_48._0_8_ != (code *)0x0) {
        (*(code *)local_48._0_8_)(&local_58,&local_58,__destroy_functor);
      }
      uVar9 = this->m_total_blocks;
      uVar6 = uVar7;
    } while (uVar7 < uVar9);
  }
  job_pool::wait_for_all((this->m_params).m_pJob_pool);
  return;
}

Assistant:

void basisu_frontend::init_endpoint_training_vectors()
	{
		debug_printf("init_endpoint_training_vectors\n");
								
		vec6F_quantizer::array_of_weighted_training_vecs &training_vecs = m_endpoint_clusterizer.get_training_vecs();
		
		training_vecs.resize(m_total_blocks * 2);

		const uint32_t N = 16384;
		for (uint32_t block_index_iter = 0; block_index_iter < m_total_blocks; block_index_iter += N)
		{
			const uint32_t first_index = block_index_iter;
			const uint32_t last_index = minimum<uint32_t>(m_total_blocks, first_index + N);

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->add_job( [this, first_index, last_index, &training_vecs] {
#endif

				for (uint32_t block_index = first_index; block_index < last_index; block_index++)
				{			
					const etc_block &blk = m_etc1_blocks_etc1s[block_index];

					color_rgba block_colors[2];
					blk.get_block_low_high_colors(block_colors, 0);
				
					vec6F v;
					v[0] = block_colors[0].r * (1.0f / 255.0f);
					v[1] = block_colors[0].g * (1.0f / 255.0f);
					v[2] = block_colors[0].b * (1.0f / 255.0f);
					v[3] = block_colors[1].r * (1.0f / 255.0f);
					v[4] = block_colors[1].g * (1.0f / 255.0f);
					v[5] = block_colors[1].b * (1.0f / 255.0f);
				
					training_vecs[block_index * 2 + 0] = std::make_pair(v, 1);
					training_vecs[block_index * 2 + 1] = std::make_pair(v, 1);

				} // block_index;

#ifndef __EMSCRIPTEN__
			} );
#endif

		} // block_index_iter

#ifndef __EMSCRIPTEN__
		m_params.m_pJob_pool->wait_for_all();
#endif
	}